

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::Chain_barcode_swap
          (Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
           *this)

{
  Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
  ::Chain_pairing(&this->
                   super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
                 );
  (this->pivotToPosition_)._M_h._M_buckets = &(this->pivotToPosition_)._M_h._M_single_bucket;
  (this->pivotToPosition_)._M_h._M_bucket_count = 1;
  (this->pivotToPosition_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pivotToPosition_)._M_h._M_element_count = 0;
  (this->pivotToPosition_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pivotToPosition_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pivotToPosition_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Chain_barcode_swap(){}